

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callHeld(TestMoreStuffImpl *this,CallHeldContext context)

{
  size_t sVar1;
  undefined4 uVar2;
  void *pvVar3;
  CallContextHook *in_RDX;
  void *__buf;
  int in_R8D;
  SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1121:7)>
  *location;
  void *continuationTracePtr;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  anon_class_8_1_bc11688f_for_func local_c8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_c0;
  code *local_b8;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  local_b0;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_a8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_70;
  Maybe<capnp::MessageSize> local_38;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_38.ptr.isSet = false;
  local_b0.hook = in_RDX;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_70,(Client *)(context.hook + 3),&local_38);
  *(undefined4 *)local_70.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_70.super_Builder._builder.data + 4) =
       *(byte *)((long)local_70.super_Builder._builder.data + 4) | 1;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::getParams((Reader *)&local_a8,&local_b0);
  uVar2 = 0;
  if (0x1f < local_a8.super_Builder._builder.dataSize) {
    uVar2 = *local_a8.super_Builder._builder.data;
  }
  *(undefined4 *)((long)local_70.super_Builder._builder.data + 8) = uVar2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_a8,(int)&local_70,__buf,(size_t)local_70.super_Builder._builder.data,in_R8D);
  local_c8.context.hook = (CallHeldContext)(CallHeldContext)local_b0.hook;
  local_b8 = kj::_::
             SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1121:7)>
             ::anon_class_8_1_bc11688f_for_func::operator();
  sVar1 = *(size_t *)&((local_a8.super_Builder._builder.segment)->super_SegmentReader).id;
  if (sVar1 == 0 || (long)local_a8.super_Builder._builder.segment - sVar1 < 0x28) {
    pvVar3 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1121:7)>
                *)((long)pvVar3 + 0x3d8);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestMoreStuffImpl::callHeld(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::TestMoreStuffImpl::callHeld(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>)::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a8,&local_c8,
               &local_b8);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    *(undefined8 *)&((local_a8.super_Builder._builder.segment)->super_SegmentReader).id = 0;
    location = (SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1121:7)>
                *)&local_a8.super_Builder._builder.segment[-1].super_SegmentReader.ptr;
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestMoreStuffImpl::callHeld(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::TestMoreStuffImpl::callHeld(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>)::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a8,&local_c8,
               &local_b8);
    local_a8.super_Builder._builder.segment[-1].super_SegmentReader.ptr.size_ = sVar1;
  }
  local_c0.ptr = (PromiseNode *)0x0;
  *(SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1121:7)>
    **)&this->super_Server = location;
  local_a8.hook.ptr = (RequestHook *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a8.hook.ptr);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_c0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_a8);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_70.hook);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callHeld(CallHeldContext context) {
  ++callCount;

  auto request = clientToHold.fooRequest();
  request.setI(123);
  request.setJ(true);
  request.setExpectedCallCount(context.getParams().getExpectedCallCount());

  return request.send().then(
      [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());
        context.getResults().setS("bar");
      }